

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O3

void __thiscall
phoenix_evsa_t::evsa_body_t::evsa_body_t
          (evsa_body_t *this,kstream *p__io,phoenix_evsa_t *p__parent,phoenix_evsa_t *p__root)

{
  pointer *__ptr;
  
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_body_t_00185180;
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
        *)0x0;
  (this->m_free_space)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
           *)&this->m_entries,(pointer)0x0);
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_free_space,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

phoenix_evsa_t::evsa_body_t::evsa_body_t(kaitai::kstream* p__io, phoenix_evsa_t* p__parent, phoenix_evsa_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_entries = nullptr;
    m_free_space = nullptr;
    _read();
}